

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

TextureFormat vkt::pipeline::anon_unknown_0::getSwizzleTargetFormat(TextureFormat format)

{
  TextureChannelClass TVar1;
  TextureChannelClass chnClass;
  TextureFormat format_local;
  
  chnClass = format.type;
  TVar1 = tcu::getTextureChannelClass(chnClass);
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    tcu::TextureFormat::TextureFormat(&format_local,RGBA,SIGNED_INT32);
  }
  else if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    tcu::TextureFormat::TextureFormat(&format_local,RGBA,UNSIGNED_INT32);
  }
  else {
    tcu::TextureFormat::TextureFormat(&format_local,RGBA,FLOAT);
  }
  return format_local;
}

Assistant:

tcu::TextureFormat getSwizzleTargetFormat (tcu::TextureFormat format)
{
	// Swizzled texture needs to hold all four channels
	// \todo [2016-09-21 pyry] We could save some memory by using smaller formats
	//						   when possible (for example U8).

	const tcu::TextureChannelClass	chnClass	= tcu::getTextureChannelClass(format.type);

	if (chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32);
	else if (chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32);
	else
		return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
}